

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

bool cfd::core::Privkey::HasWif(string *wif,NetType *net_type,bool *is_compressed)

{
  bool bVar1;
  uint32_t uVar2;
  NetType NVar3;
  char *wif_00;
  __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
  *__lhs;
  byte *pbVar4;
  reference this;
  ByteData *__return_storage_ptr__;
  char *local_d8;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  KeyFormatData *format;
  iterator __end4;
  iterator __begin4;
  vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *__range4;
  undefined1 local_78 [3];
  bool has_prefix;
  uint32_t prefix;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_50 [8];
  ByteData data;
  bool has_wif;
  size_t sStack_30;
  int ret;
  size_t is_uncompressed;
  bool *is_compressed_local;
  NetType *net_type_local;
  string *wif_local;
  
  sStack_30 = 0;
  is_uncompressed = (size_t)is_compressed;
  is_compressed_local = (bool *)net_type;
  net_type_local = (NetType *)wif;
  wif_00 = (char *)::std::__cxx11::string::c_str();
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       wally_wif_is_uncompressed(wif_00,&stack0xffffffffffffffd0);
  if (data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __return_storage_ptr__ = (ByteData *)local_50;
    CryptoUtil::DecodeBase58Check(__return_storage_ptr__,(string *)net_type_local);
    __lhs = (__normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
             *)ByteData::GetDataSize(__return_storage_ptr__);
    if ((__normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
         *)0x20 < __lhs) {
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                         (ByteData *)local_50);
      pbVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,0);
      __range4._4_4_ = (uint)*pbVar4;
      if (is_compressed_local != (bool *)0x0) {
        __range4._3_1_ = 0;
        GetKeyFormatList();
        __end4 = ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>
                 ::begin((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>
                          *)__return_storage_ptr__);
        ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::end
                  ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                   __return_storage_ptr__);
        while (bVar1 = __gnu_cxx::operator!=
                                 (__lhs,(__normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
                                         *)__return_storage_ptr__), bVar1) {
          this = __gnu_cxx::
                 __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
                 ::operator*(&__end4);
          uVar2 = KeyFormatData::GetWifPrefix(this);
          if (uVar2 == __range4._4_4_) {
            NVar3 = KeyFormatData::GetNetType(this);
            *(NetType *)is_compressed_local = NVar3;
            __range4._3_1_ = 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
          ::operator++(&__end4);
        }
        ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                  ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        if ((__range4._3_1_ & 1) == 0) {
          local_d8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
                             ,0x2f);
          local_d8 = local_d8 + 1;
          in_stack_ffffffffffffff30 = 0x31c;
          logger::warn<unsigned_int&>
                    ((CfdSourceLocation *)&local_d8,"Invalid Privkey format. prefix={}",
                     (uint *)((long)&__range4 + 4));
          is_compressed_local[0] = true;
          is_compressed_local[1] = false;
          is_compressed_local[2] = false;
          is_compressed_local[3] = false;
        }
      }
      if (is_uncompressed != 0) {
        *(byte *)is_uncompressed = -(sStack_30 == 0) & 1;
      }
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
    wif_local._7_1_ =
         data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._3_1_ & 1;
    ByteData::~ByteData((ByteData *)0x472f1a);
  }
  else {
    wif_local._7_1_ = 0;
  }
  return (bool)(wif_local._7_1_ & 1);
}

Assistant:

bool Privkey::HasWif(
    const std::string &wif, NetType *net_type, bool *is_compressed) {
  static constexpr size_t kWifMinimumSize = EC_PRIVATE_KEY_LEN + 1;

  size_t is_uncompressed = 0;
  int ret = wally_wif_is_uncompressed(wif.c_str(), &is_uncompressed);
  if (ret != WALLY_OK) {
    // contains check wif.
    return false;
  }

  bool has_wif = false;
  ByteData data = CryptoUtil::DecodeBase58Check(wif);
  if (data.GetDataSize() >= kWifMinimumSize) {
    std::vector<uint8_t> key_data = data.GetBytes();
    uint32_t prefix = key_data[0];

    if (net_type != nullptr) {
      bool has_prefix = false;
      for (const auto &format : GetKeyFormatList()) {
        if (format.GetWifPrefix() == prefix) {
          *net_type = format.GetNetType();
          has_prefix = true;
          break;
        }
      }
      if (!has_prefix) {
        warn(CFD_LOG_SOURCE, "Invalid Privkey format. prefix={}", prefix);
        *net_type = NetType::kTestnet;
      }
    }

    if (is_compressed != nullptr) {
      *is_compressed = (is_uncompressed == 0) ? true : false;
    }
    has_wif = true;
  }
  return has_wif;
}